

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  bool bVar1;
  bool bVar2;
  char *local_80;
  allocator<char> local_55 [20];
  byte local_41;
  string local_40;
  Type *local_20;
  Type *type_local;
  CSharpGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  local_41 = 0;
  bVar2 = false;
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(&local_40,this,local_20,false);
    local_41 = 1;
    ConvertCase(__return_storage_ptr__,&local_40,kUpperCamel,kSnake);
  }
  else {
    bVar2 = IsStruct(local_20);
    if (bVar2) {
      local_80 = "Struct";
    }
    else {
      local_80 = "Offset";
    }
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_80,local_55);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(local_55);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const Type &type) const {
    return IsScalar(type.base_type)
               ? ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel)
               : (IsStruct(type) ? "Struct" : "Offset");
  }